

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O2

bool __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
eqParticles_<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef>
          (BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *this,ParticleRef a,ParticleRef b
          )

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  PositionType PVar5;
  PositionType PVar6;
  MomentumType local_50;
  MomentumType local_38;
  
  PVar5 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getPosition
                    (&a.super_ConstParticleRef);
  PVar6 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getPosition
                    (&b.super_ConstParticleRef);
  if ((PVar5.x == PVar6.x) && (!NAN(PVar5.x) && !NAN(PVar6.x))) {
    if ((PVar5.y == PVar6.y) && (!NAN(PVar5.y) && !NAN(PVar6.y))) {
      pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
                (&local_38,&a.super_ConstParticleRef);
      pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
                (&local_50,&b.super_ConstParticleRef);
      if ((local_38.x == local_50.x) && (!NAN(local_38.x) && !NAN(local_50.x))) {
        if ((local_38.y == local_50.y) && (!NAN(local_38.y) && !NAN(local_50.y))) {
          if ((local_38.z == local_50.z) && (!NAN(local_38.z) && !NAN(local_50.z))) {
            lVar3 = (long)((a.super_ConstParticleRef.particles)->typeIndex).
                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start[a.super_ConstParticleRef.idx] * 0x10;
            dVar2 = *(double *)(pica::ParticleTypes::types + lVar3);
            lVar4 = (long)((b.super_ConstParticleRef.particles)->typeIndex).
                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start[b.super_ConstParticleRef.idx] * 0x10;
            pdVar1 = (double *)(pica::ParticleTypes::types + lVar4);
            if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
              dVar2 = *(double *)(pica::ParticleTypes::types + 8 + lVar3);
              pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar4);
              if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
                return (bool)(-(((b.super_ConstParticleRef.particles)->factors).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[b.super_ConstParticleRef.idx] ==
                               ((a.super_ConstParticleRef.particles)->factors).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[a.super_ConstParticleRef.idx]) & 1);
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool eqParticles_(ConstParticleRef1 a, ConstParticleRef2 b) const
    {
        return (a.getPosition() == b.getPosition()) &&
            (a.getMomentum() == b.getMomentum()) &&
            (a.getMass() == b.getMass()) &&
            (a.getCharge() == b.getCharge()) &&
            (a.getFactor() == b.getFactor());
    }